

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O3

filepos_t __thiscall
libebml::EbmlUnicodeString::RenderData
          (EbmlUnicodeString *this,IOCallback *output,bool param_2,bool param_3)

{
  ulong uVar1;
  void *__s;
  ulong __n;
  filepos_t Size;
  
  Size = (filepos_t)(uint)(this->Value).UTF8string._M_string_length;
  if (Size != 0) {
    IOCallback::writeFully(output,(this->Value).UTF8string._M_dataplus._M_p,Size);
  }
  uVar1 = (this->super_EbmlElement).DefaultSize;
  __n = uVar1 - Size;
  if (Size <= uVar1 && __n != 0) {
    __s = operator_new__(__n,(nothrow_t *)&std::nothrow);
    if (__s != (void *)0x0) {
      memset(__s,0,__n);
      IOCallback::writeFully(output,__s,__n);
      Size = (filepos_t)(uint)(this->super_EbmlElement).DefaultSize;
      operator_delete__(__s);
    }
  }
  return Size;
}

Assistant:

filepos_t EbmlUnicodeString::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  uint32 Result = Value.GetUTF8().length();

  if (Result != 0) {
    output.writeFully(Value.GetUTF8().c_str(), Result);
  }

  if (Result < GetDefaultSize()) {
    // pad the rest with 0
    binary *Pad = new (std::nothrow) binary[GetDefaultSize() - Result];
    if (Pad != NULL) {
      memset(Pad, 0x00, GetDefaultSize() - Result);
      output.writeFully(Pad, GetDefaultSize() - Result);

      Result = GetDefaultSize();
      delete [] Pad;
    }
  }

  return Result;
}